

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O0

void __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::DestroyDefaultViews
          (TextureBase<Diligent::EngineVkImplTraits> *this)

{
  TextureViewVkImpl *this_00;
  Uint32 UVar1;
  TextureViewImplType **ppTVar2;
  RenderDeviceVkImpl *this_01;
  Char *Message;
  IMemoryAllocator *pIVar3;
  TextureViewImplType *pView;
  Uint32 i;
  undefined1 local_48 [8];
  string msg;
  TexViewObjAllocatorType *TexViewAllocator;
  TextureViewImplType **ppDefaultViews;
  Uint32 NumViews;
  TextureBase<Diligent::EngineVkImplTraits> *this_local;
  
  if (this->m_pDefaultViews != (void *)0x0) {
    UVar1 = GetNumDefaultViews(this);
    ppTVar2 = GetDefaultViewsArrayPtr(this);
    this_01 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              ::GetDevice(&this->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         );
    msg.field_2._8_8_ =
         RenderDeviceBase<Diligent::EngineVkImplTraits>::GetTexViewObjAllocator
                   ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_01);
    if ((FixedBlockMemoryAllocator *)msg.field_2._8_8_ != this->m_dbgTexViewObjAllocator) {
      FormatString<char[87]>
                ((string *)local_48,
                 (char (*) [87])
                 "Texture view allocator does not match allocator provided during texture initialization"
                );
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"DestroyDefaultViews",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x161);
      std::__cxx11::string::~string((string *)local_48);
    }
    for (pView._0_4_ = 0; (uint)pView < UVar1; pView._0_4_ = (uint)pView + 1) {
      this_00 = ppTVar2[(uint)pView];
      if (this_00 != (TextureViewVkImpl *)0x0) {
        TextureViewVkImpl::~TextureViewVkImpl(this_00);
        FixedBlockMemoryAllocator::Free((FixedBlockMemoryAllocator *)msg.field_2._8_8_,this_00);
      }
    }
    if (1 < UVar1) {
      pIVar3 = GetRawAllocator();
      (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_pDefaultViews);
    }
    this->m_pDefaultViews = (void *)0x0;
  }
  return;
}

Assistant:

void DestroyDefaultViews()
    {
        if (m_pDefaultViews == nullptr)
            return;

        const Uint32          NumViews       = GetNumDefaultViews();
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        TexViewObjAllocatorType& TexViewAllocator = this->GetDevice()->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        for (Uint32 i = 0; i < NumViews; ++i)
        {
            if (TextureViewImplType* pView = ppDefaultViews[i])
            {
                pView->~TextureViewImplType();
                TexViewAllocator.Free(pView);
            }
        }

        if (NumViews > 1)
        {
            GetRawAllocator().Free(m_pDefaultViews);
        }

        m_pDefaultViews = nullptr;
    }